

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall
cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value,bool is_binary)

{
  undefined3 in_register_00000011;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ScriptElement(this,value);
  if ((CONCAT31(in_register_00000011,is_binary) != 0) && (this->type_ == kElementOpCode)) {
    this->type_ = kElementNumber;
    SerializeScriptNum((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48,
                       this->value_);
    ByteData::ByteData((ByteData *)&local_30,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(this->binary_data_).data_,&local_30);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value, bool is_binary)
    : ScriptElement(value) {
  if (is_binary && type_ == kElementOpCode) {
    type_ = kElementNumber;
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}